

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O2

void __thiscall arma::Mat<double>::Mat(Mat<double> *this,uword in_n_rows,uword in_n_cols)

{
  this->n_rows = in_n_rows;
  this->n_cols = in_n_cols;
  this->n_elem = in_n_cols * in_n_rows;
  this->mem = (double *)0x0;
  this->n_alloc = 0;
  this->vec_state = 0;
  this->mem_state = 0;
  init_cold(this);
  if ((ulong)this->n_elem != 0) {
    memset(this->mem,0,(ulong)this->n_elem << 3);
    return;
  }
  return;
}

Assistant:

inline
Mat<eT>::Mat(const uword in_n_rows, const uword in_n_cols)
  : n_rows(in_n_rows)
  , n_cols(in_n_cols)
  , n_elem(in_n_rows*in_n_cols)
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  init_cold();
  
  arma_debug_print("Mat::constructor: zeroing memory");
  
  arrayops::fill_zeros(memptr(), n_elem);
  }